

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FIReader.cpp
# Opt level: O1

shared_ptr<Assimp::FIShortValue> __thiscall
Assimp::FIShortValue::create(FIShortValue *this,vector<short,_std::allocator<short>_> *value)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<Assimp::FIShortValue> sVar1;
  undefined1 local_29;
  FIValue local_28;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_20;
  
  local_28._vptr_FIValue = (_func_int **)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<Assimp::FIShortValueImpl,std::allocator<Assimp::FIShortValueImpl>,std::vector<short,std::allocator<short>>>
            (&local_20,(FIShortValueImpl **)&local_28,
             (allocator<Assimp::FIShortValueImpl> *)&local_29,value);
  (this->super_FIValue)._vptr_FIValue = local_28._vptr_FIValue;
  (this->value).super__Vector_base<short,_std::allocator<short>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->value).super__Vector_base<short,_std::allocator<short>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)local_20._M_pi;
  sVar1.super___shared_ptr<Assimp::FIShortValue,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar1.super___shared_ptr<Assimp::FIShortValue,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this;
  return (shared_ptr<Assimp::FIShortValue>)
         sVar1.super___shared_ptr<Assimp::FIShortValue,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<FIShortValue> FIShortValue::create(std::vector<int16_t> &&value) {
    return std::make_shared<FIShortValueImpl>(std::move(value));
}